

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.hpp
# Opt level: O2

void __thiscall
pstore::database::sizes::update_footer_pos
          (sizes *this,typed_address<pstore::trailer> new_footer_pos)

{
  ulong uVar1;
  
  if (0x3f < (ulong)new_footer_pos.a_.a_) {
    (this->footer_pos_).a_.a_ = (value_type)new_footer_pos.a_.a_;
    uVar1 = (long)new_footer_pos.a_.a_ + 0x70U;
    if ((long)new_footer_pos.a_.a_ + 0x70U < this->logical_) {
      uVar1 = this->logical_;
    }
    this->logical_ = uVar1;
    return;
  }
  assert_failed("new_footer_pos.absolute () >= leader_size",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/database.hpp"
                ,0x1a1);
}

Assistant:

void update_footer_pos (typed_address<trailer> const new_footer_pos) noexcept {
                PSTORE_ASSERT (new_footer_pos.absolute () >= leader_size);
                footer_pos_ = new_footer_pos;
                logical_ = std::max (logical_, footer_pos_.absolute () + sizeof (trailer));
            }